

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall TArray<FTeam,_FTeam>::Push(TArray<FTeam,_FTeam> *this,FTeam *item)

{
  uint uVar1;
  
  Grow(this,1);
  FTeam::FTeam(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}